

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

NetworkUpdateParameters * __thiscall
CoreML::Specification::NeuralNetworkRegressor::mutable_updateparams(NeuralNetworkRegressor *this)

{
  NetworkUpdateParameters *this_00;
  
  this_00 = this->updateparams_;
  if (this_00 == (NetworkUpdateParameters *)0x0) {
    this_00 = (NetworkUpdateParameters *)operator_new(0x50);
    NetworkUpdateParameters::NetworkUpdateParameters(this_00);
    this->updateparams_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::NetworkUpdateParameters* NeuralNetworkRegressor::mutable_updateparams() {
  
  if (updateparams_ == NULL) {
    updateparams_ = new ::CoreML::Specification::NetworkUpdateParameters;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkRegressor.updateParams)
  return updateparams_;
}